

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O1

bool __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
::PrepareNextSolveIteration
          (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           *this,function<mp::sol::Status_()> *get_stt,function<mp::Solution_()> *get_sol)

{
  int iVar1;
  bool bVar2;
  _Any_data local_50;
  _Manager_type local_40;
  _Any_data local_30;
  _Manager_type local_20;
  
  if (((this->
       super_MOManager<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
       ).status_ & ~NOT_ACTIVE) == RUNNING) {
    std::function<mp::sol::Status_()>::function((function<mp::sol::Status_()> *)&local_30,get_stt);
    std::function<mp::Solution_()>::function((function<mp::Solution_()> *)&local_50,get_sol);
    bVar2 = MOManager<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
            ::PrepareMOIteration
                      (&this->
                        super_MOManager<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                       ,(function<mp::sol::Status_()> *)&local_30,
                       (function<mp::Solution_()> *)&local_50);
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
    if (local_20 != (code *)0x0) {
      (*local_20)(&local_30,&local_30,__destroy_functor);
    }
  }
  else {
    iVar1 = this->n_solve_iter_;
    this->n_solve_iter_ = iVar1 + 1;
    bVar2 = iVar1 == 0;
  }
  return bVar2;
}

Assistant:

bool PrepareNextSolveIteration(
      std::function<sol::Status(void)> get_stt, std::function<Solution(void)> get_sol) {
    if (MPCD( IsMOActive() ))
      return MPD( PrepareMOIteration(get_stt, get_sol) );
    return !(n_solve_iter_++);
  }